

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall OneWireAnalyzerSettings::SetSettingsFromInterfaces(OneWireAnalyzerSettings *this)

{
  bool bVar1;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mOneWireChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  bVar1 = (bool)AnalyzerSettingInterfaceBool::GetValue();
  this->mOverdrive = bVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mOneWireChannel,true);
  return true;
}

Assistant:

bool OneWireAnalyzerSettings::SetSettingsFromInterfaces()
{
    mOneWireChannel = mOneWireChannelInterface->GetChannel();
    mOverdrive = mOverDriveInterface->GetValue();

    ClearChannels();
    AddChannel( mOneWireChannel, "1-WIRE", true );

    return true;
}